

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall ParserTestResponseFiles::Run(ParserTestResponseFiles *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Rule *this_00;
  Test *pTVar3;
  bool bVar4;
  int iVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  *pmVar6;
  EvalString *pEVar7;
  BindingEnv *this_01;
  string local_70;
  string local_50;
  
  iVar5 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat_rsp\n  command = cat $rspfile > $out\n  rspfile = $rspfile\n  rspfile_content = $in\n\nbuild out: cat_rsp in\n  rspfile=out.rsp\n"
            );
  pTVar3 = g_current_test;
  if (iVar5 == g_current_test->assertion_failures_) {
    this_01 = &(this->super_ParserTest).state.bindings_;
    pmVar6 = BindingEnv::GetRules_abi_cxx11_(this_01);
    bVar4 = testing::Test::Check
                      (pTVar3,(pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x77,"2u == state.bindings_.GetRules().size()");
    if (bVar4) {
      pmVar6 = BindingEnv::GetRules_abi_cxx11_(this_01);
      pTVar3 = g_current_test;
      this_00 = *(Rule **)((pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left + 2);
      iVar5 = std::__cxx11::string::compare((char *)this_00);
      testing::Test::Check
                (pTVar3,iVar5 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x79,"\"cat_rsp\" == rule->name()");
      pTVar3 = g_current_test;
      paVar1 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"command","");
      pEVar7 = Rule::GetBinding(this_00,&local_70);
      EvalString::Serialize_abi_cxx11_(&local_50,pEVar7);
      iVar5 = std::__cxx11::string::compare((char *)&local_50);
      testing::Test::Check
                (pTVar3,iVar5 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x7b,
                 "\"[cat ][$rspfile][ > ][$out]\" == rule->GetBinding(\"command\")->Serialize()");
      paVar2 = &local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = g_current_test;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rspfile","");
      pEVar7 = Rule::GetBinding(this_00,&local_70);
      EvalString::Serialize_abi_cxx11_(&local_50,pEVar7);
      iVar5 = std::__cxx11::string::compare((char *)&local_50);
      testing::Test::Check
                (pTVar3,iVar5 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x7c,"\"[$rspfile]\" == rule->GetBinding(\"rspfile\")->Serialize()");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = g_current_test;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rspfile_content","");
      pEVar7 = Rule::GetBinding(this_00,&local_70);
      EvalString::Serialize_abi_cxx11_(&local_50,pEVar7);
      iVar5 = std::__cxx11::string::compare((char *)&local_50);
      testing::Test::Check
                (pTVar3,iVar5 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x7d,"\"[$in]\" == rule->GetBinding(\"rspfile_content\")->Serialize()");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, ResponseFiles) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat_rsp\n"
"  command = cat $rspfile > $out\n"
"  rspfile = $rspfile\n"
"  rspfile_content = $in\n"
"\n"
"build out: cat_rsp in\n"
"  rspfile=out.rsp\n"));

  ASSERT_EQ(2u, state.bindings_.GetRules().size());
  const Rule* rule = state.bindings_.GetRules().begin()->second;
  EXPECT_EQ("cat_rsp", rule->name());
  EXPECT_EQ("[cat ][$rspfile][ > ][$out]",
            rule->GetBinding("command")->Serialize());
  EXPECT_EQ("[$rspfile]", rule->GetBinding("rspfile")->Serialize());
  EXPECT_EQ("[$in]", rule->GetBinding("rspfile_content")->Serialize());
}